

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonResult(JsonString *p)

{
  if (p->bErr != '\0') {
    return;
  }
  sqlite3_result_text64
            (p->pCtx,p->zBuf,p->nUsed,
             (_func_void_void_ptr *)(-(ulong)(p->bStatic != '\0') | (ulong)sqlite3_free),'\x01');
  p->zBuf = p->zSpace;
  p->nAlloc = 100;
  p->nUsed = 0;
  p->bStatic = '\x01';
  return;
}

Assistant:

static void jsonResult(JsonString *p){
  if( p->bErr==0 ){
    sqlite3_result_text64(p->pCtx, p->zBuf, p->nUsed,
                          p->bStatic ? SQLITE_TRANSIENT : sqlite3_free,
                          SQLITE_UTF8);
    jsonZero(p);
  }
  assert( p->bStatic );
}